

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjIterLookupTable::restore_from_file
          (CVmObjIterLookupTable *this,vm_obj_id_t param_2,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  size_t in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,9,in_RDI);
  *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  CVmFile::read_bytes((CVmFile *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX);
  CVmObjFixup::fix_dh((CVmObjFixup *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return;
}

Assistant:

void CVmObjIterLookupTable::restore_from_file(VMG_ vm_obj_id_t,
                                              CVmFile *fp,
                                              CVmObjFixup *fixups)
{
    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate a new extension */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERLOOKUPTABLE_EXT_SIZE, this);

    /* read my extension */
    fp->read_bytes(ext_, VMOBJITERLOOKUPTABLE_EXT_SIZE);

    /* fix up my collection object reference */
    fixups->fix_dh(vmg_ ext_);
}